

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void palette_reset(Terminal *term,_Bool keep_overrides)

{
  ulong uVar1;
  uint8_t uVar2;
  int iVar3;
  rgb *prVar4;
  uint8_t local_68;
  uint8_t local_64;
  uint8_t local_60;
  uint local_5c;
  uint local_58;
  uint i_5;
  uint i_4;
  wchar_t shade;
  rgb *col_2;
  uint i_3;
  wchar_t b;
  wchar_t g;
  wchar_t r;
  rgb *col_1;
  uint i_2;
  rgb *col;
  uint local_18;
  uint i_1;
  uint i;
  _Bool keep_overrides_local;
  Terminal *term_local;
  
  for (local_18 = 0; local_18 < 0x106; local_18 = local_18 + 1) {
    term->subpalettes[0].present[local_18] = true;
  }
  for (col._4_4_ = 0; col._4_4_ < 0x16; col._4_4_ = col._4_4_ + 1) {
    prVar4 = term->subpalettes[0].values + colour_indices_conf_to_osc4[col._4_4_];
    iVar3 = conf_get_int_int(term->conf,0x95,col._4_4_ * 3);
    prVar4->r = (uint8_t)iVar3;
    iVar3 = conf_get_int_int(term->conf,0x95,col._4_4_ * 3 + 1);
    prVar4->g = (uint8_t)iVar3;
    iVar3 = conf_get_int_int(term->conf,0x95,col._4_4_ * 3 + 2);
    prVar4->b = (uint8_t)iVar3;
  }
  for (col_1._4_4_ = 0; col_1._4_4_ < 0xd8; col_1._4_4_ = col_1._4_4_ + 1) {
    prVar4 = term->subpalettes[0].values + (col_1._4_4_ + 0x10);
    uVar1 = ((ulong)col_1._4_4_ / 6) % 6;
    if (col_1._4_4_ / 0x24 == 0) {
      local_60 = '\0';
    }
    else {
      local_60 = (char)(col_1._4_4_ / 0x24) * '(' + '7';
    }
    prVar4->r = local_60;
    if ((int)uVar1 == 0) {
      local_64 = '\0';
    }
    else {
      local_64 = (char)uVar1 * '(' + '7';
    }
    prVar4->g = local_64;
    if (col_1._4_4_ % 6 == 0) {
      local_68 = '\0';
    }
    else {
      local_68 = (char)(col_1._4_4_ % 6) * '(' + '7';
    }
    prVar4->b = local_68;
  }
  for (col_2._0_4_ = 0; (uint)col_2 < 0x18; col_2._0_4_ = (uint)col_2 + 1) {
    prVar4 = term->subpalettes[0].values + ((uint)col_2 + 0xe8);
    uVar2 = (char)(uint)col_2 * '\n' + '\b';
    prVar4->b = uVar2;
    prVar4->g = uVar2;
    prVar4->r = uVar2;
  }
  for (local_58 = 0; local_58 < 0x106; local_58 = local_58 + 1) {
    term->subpalettes[1].present[local_58] = false;
  }
  win_palette_get_overrides(term->win,term);
  if (!keep_overrides) {
    for (local_5c = 0; local_5c < 0x106; local_5c = local_5c + 1) {
      term->subpalettes[2].present[local_5c] = false;
    }
  }
  palette_rebuild(term);
  return;
}

Assistant:

static void palette_reset(Terminal *term, bool keep_overrides)
{
    for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
        term->subpalettes[SUBPAL_CONF].present[i] = true;

    /*
     * Copy all the palette information out of the Conf.
     */
    for (unsigned i = 0; i < CONF_NCOLOURS; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[
            colour_indices_conf_to_osc4[i]];
        col->r = conf_get_int_int(term->conf, CONF_colours, i*3+0);
        col->g = conf_get_int_int(term->conf, CONF_colours, i*3+1);
        col->b = conf_get_int_int(term->conf, CONF_colours, i*3+2);
    }

    /*
     * Directly invent the rest of the xterm-256 colours.
     */
    for (unsigned i = 0; i < 216; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[i + 16];
        int r = i / 36, g = (i / 6) % 6, b = i % 6;
        col->r = r ? r * 40 + 55 : 0;
        col->g = g ? g * 40 + 55 : 0;
        col->b = b ? b * 40 + 55 : 0;
    }
    for (unsigned i = 0; i < 24; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[i + 232];
        int shade = i * 10 + 8;
        col->r = col->g = col->b = shade;
    }

    /*
     * Re-fetch any OS-local overrides.
     */
    for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
        term->subpalettes[SUBPAL_PLATFORM].present[i] = false;
    win_palette_get_overrides(term->win, term);

    if (!keep_overrides) {
        /*
         * Get rid of all escape-sequence configuration.
         */
        for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
            term->subpalettes[SUBPAL_SESSION].present[i] = false;
    }

    /*
     * Rebuild the composite palette.
     */
    palette_rebuild(term);
}